

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool ON_Font::EqualStyle(ON_Font *lhs,ON_Font *rhs,bool bUnsetIsEqual)

{
  bool bUnsetIsEqual_local;
  ON_Font *rhs_local;
  ON_Font *lhs_local;
  
  if ((lhs == (ON_Font *)0x0) || (rhs == (ON_Font *)0x0)) {
    return false;
  }
  if (lhs->m_font_style != rhs->m_font_style) {
    if (!bUnsetIsEqual) {
      return false;
    }
    if ((lhs->m_font_style != Unset) && (rhs->m_font_style != Unset)) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ON_Font::EqualStyle(
  const ON_Font* lhs,
  const ON_Font* rhs,
  bool bUnsetIsEqual
)
{
  if (nullptr == lhs || nullptr == rhs)
    return false;
  if (lhs->m_font_style != rhs->m_font_style)
  {
    if (false == bUnsetIsEqual)
      return false;
    if (ON_Font::Style::Unset != lhs->m_font_style && ON_Font::Style::Unset != rhs->m_font_style)
      return false;
  }
  return true;
}